

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CCtx_params *
ZSTD_assignParamsToCCtxParams
          (ZSTD_CCtx_params *__return_storage_ptr__,ZSTD_CCtx_params *cctxParams,
          ZSTD_parameters *params)

{
  uint uVar1;
  uint uVar2;
  ZSTD_strategy ZVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  memcpy(__return_storage_ptr__,cctxParams,0x90);
  if ((((0xffffffe9 < (params->cParams).windowLog - 0x20) &&
       (0xffffffe6 < (params->cParams).chainLog - 0x1f)) &&
      (0xffffffe6 < (params->cParams).hashLog - 0x1f)) &&
     (((0xffffffe1 < (params->cParams).searchLog - 0x1f && ((params->cParams).minMatch - 3 < 5)) &&
      (((params->cParams).targetLength < 0x20001 && ((params->cParams).strategy - ZSTD_fast < 9)))))
     ) {
    uVar4 = (params->cParams).windowLog;
    uVar5 = (params->cParams).chainLog;
    uVar6 = (params->cParams).hashLog;
    uVar7 = (params->cParams).searchLog;
    uVar1 = (params->cParams).minMatch;
    uVar2 = (params->cParams).targetLength;
    ZVar3 = (params->cParams).strategy;
    (__return_storage_ptr__->cParams).searchLog = (params->cParams).searchLog;
    (__return_storage_ptr__->cParams).minMatch = uVar1;
    (__return_storage_ptr__->cParams).targetLength = uVar2;
    (__return_storage_ptr__->cParams).strategy = ZVar3;
    (__return_storage_ptr__->cParams).windowLog = uVar4;
    (__return_storage_ptr__->cParams).chainLog = uVar5;
    (__return_storage_ptr__->cParams).hashLog = uVar6;
    (__return_storage_ptr__->cParams).searchLog = uVar7;
    iVar8 = (params->fParams).checksumFlag;
    (__return_storage_ptr__->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
    (__return_storage_ptr__->fParams).checksumFlag = iVar8;
    (__return_storage_ptr__->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
    __return_storage_ptr__->compressionLevel = 3;
    return __return_storage_ptr__;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2b4d,
                "ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(const ZSTD_CCtx_params *, const ZSTD_parameters *)"
               );
}

Assistant:

static ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(
        const ZSTD_CCtx_params* cctxParams, const ZSTD_parameters* params)
{
    ZSTD_CCtx_params ret = *cctxParams;
    assert(!ZSTD_checkCParams(params->cParams));
    ret.cParams = params->cParams;
    ret.fParams = params->fParams;
    ret.compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    return ret;
}